

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<std::pair<int,_long>,_60>::Resize
          (TPZManVector<std::pair<int,_long>,_60> *this,int64_t newsize,pair<int,_long> *object)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  pair<int,_long> *ppVar4;
  pair<int,_long> *ppVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  double dVar11;
  
  if (newsize < 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
    return;
  }
  lVar7 = (this->super_TPZVec<std::pair<int,_long>_>).fNElements;
  if (lVar7 != newsize) {
    lVar9 = (this->super_TPZVec<std::pair<int,_long>_>).fNAlloc;
    if (lVar9 < newsize) {
      if ((ulong)newsize < 0x3d) {
        ppVar4 = (this->super_TPZVec<std::pair<int,_long>_>).fStore;
        lVar2 = 0;
        lVar9 = lVar7;
        if (lVar7 < 1) {
          lVar7 = lVar2;
          lVar9 = lVar2;
        }
        while (lVar7 != 0) {
          *(undefined4 *)((long)&this->fExtAlloc[0].first + lVar2) =
               *(undefined4 *)((long)&ppVar4->first + lVar2);
          *(undefined8 *)((long)&this->fExtAlloc[0].second + lVar2) =
               *(undefined8 *)((long)&ppVar4->second + lVar2);
          lVar2 = lVar2 + 0x10;
          lVar7 = lVar7 + -1;
        }
        plVar6 = &this->fExtAlloc[lVar9].second;
        for (; lVar9 < newsize; lVar9 = lVar9 + 1) {
          ((pair<int,_long> *)(plVar6 + -1))->first = object->first;
          *plVar6 = object->second;
          plVar6 = plVar6 + 2;
        }
        if (ppVar4 != (pair<int,_long> *)0x0 && ppVar4 != this->fExtAlloc) {
          operator_delete__(ppVar4);
        }
        (this->super_TPZVec<std::pair<int,_long>_>).fStore = this->fExtAlloc;
        (this->super_TPZVec<std::pair<int,_long>_>).fNElements = newsize;
        (this->super_TPZVec<std::pair<int,_long>_>).fNAlloc = 0x3c;
      }
      else {
        dVar11 = (double)lVar9 * 1.2;
        uVar8 = (long)dVar11;
        if (dVar11 < (double)newsize) {
          uVar8 = newsize;
        }
        ppVar4 = (pair<int,_long> *)operator_new__(-(ulong)(uVar8 >> 0x3c != 0) | uVar8 * 0x10);
        if (uVar8 != 0) {
          ppVar5 = ppVar4;
          do {
            ppVar5->first = 0;
            ppVar5->second = 0;
            ppVar5 = ppVar5 + 1;
          } while (ppVar5 != ppVar4 + uVar8);
        }
        ppVar5 = (this->super_TPZVec<std::pair<int,_long>_>).fStore;
        lVar9 = 0;
        if (0 < lVar7) {
          lVar9 = lVar7;
        }
        lVar7 = 8;
        lVar2 = lVar9;
        while (bVar10 = lVar2 != 0, lVar2 = lVar2 + -1, bVar10) {
          *(undefined4 *)((long)ppVar4 + lVar7 + -8) = *(undefined4 *)((long)ppVar5 + lVar7 + -8);
          *(undefined8 *)((long)&ppVar4->first + lVar7) =
               *(undefined8 *)((long)&ppVar5->first + lVar7);
          lVar7 = lVar7 + 0x10;
        }
        iVar1 = object->first;
        lVar7 = object->second;
        plVar6 = &ppVar4[lVar9].second;
        for (; lVar9 < newsize; lVar9 = lVar9 + 1) {
          ((pair<int,_long> *)(plVar6 + -1))->first = iVar1;
          *plVar6 = lVar7;
          plVar6 = plVar6 + 2;
        }
        if (ppVar5 != (pair<int,_long> *)0x0 && ppVar5 != this->fExtAlloc) {
          operator_delete__(ppVar5);
        }
        (this->super_TPZVec<std::pair<int,_long>_>).fStore = ppVar4;
        (this->super_TPZVec<std::pair<int,_long>_>).fNElements = newsize;
        (this->super_TPZVec<std::pair<int,_long>_>).fNAlloc = uVar8;
      }
    }
    else {
      plVar6 = &(this->super_TPZVec<std::pair<int,_long>_>).fStore[lVar7].second;
      for (; lVar7 < newsize; lVar7 = lVar7 + 1) {
        ((pair<int,_long> *)(plVar6 + -1))->first = object->first;
        *plVar6 = object->second;
        plVar6 = plVar6 + 2;
      }
      (this->super_TPZVec<std::pair<int,_long>_>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}